

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Join
          (Relation *this,shared_ptr<duckdb::Relation,_true> *other,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expression_list,JoinType type,JoinRefType ref_type)

{
  pointer puVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer pbVar3;
  bool bVar4;
  reference pvVar5;
  pointer pPVar6;
  BaseExpression *this_00;
  ColumnRefExpression *this_01;
  reference __x;
  ParserException *pPVar7;
  undefined7 in_register_00000009;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  pointer this_03;
  shared_ptr<duckdb::Relation,_true> sVar9;
  JoinRefType ref_type_local;
  JoinType type_local;
  undefined1 local_99;
  enable_shared_from_this<duckdb::Relation> local_98;
  undefined1 local_88 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  using_columns;
  enable_shared_from_this<duckdb::Relation> local_48;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *local_38;
  
  this_02 = (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             *)CONCAT71(in_register_00000009,type);
  type_local = ref_type;
  if ((ulong)((long)(this_02->
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ).
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_02->
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 9) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::operator[](this_02,0);
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(pvVar5);
    if ((pPVar6->super_BaseExpression).type != COLUMN_REF) {
      enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_98);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](this_02,0);
      local_88._0_8_ = (JoinRelation *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::JoinRelation,std::allocator<duckdb::JoinRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::shared_ptr<duckdb::Relation,true>const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::JoinType&,duckdb::JoinRefType&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                 (JoinRelation **)local_88,(allocator<duckdb::JoinRelation> *)&local_48,
                 (shared_ptr<duckdb::Relation,_true> *)&local_98,
                 (shared_ptr<duckdb::Relation,_true> *)expression_list,pvVar5,&type_local,
                 &ref_type_local);
      shared_ptr<duckdb::JoinRelation,_true>::shared_ptr
                ((shared_ptr<duckdb::JoinRelation,_true> *)&using_columns,
                 (shared_ptr<duckdb::JoinRelation> *)local_88);
      _Var8._M_pi = extraout_RDX_00;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        _Var8._M_pi = extraout_RDX_01;
      }
      pbVar3 = using_columns.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
      super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      using_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this->_vptr_Relation =
           (_func_int **)
           using_columns.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
      super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pbVar3
      ;
      using_columns.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if ((element_type *)
          local_98.__weak_this_.internal.
          super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.__weak_this_.internal.
                   super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
        _Var8._M_pi = extraout_RDX_02;
      }
      goto LAB_004e2cce;
    }
  }
  using_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  using_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  using_columns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_03 = (this_02->
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this_02->
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = expression_list;
  if (this_03 != puVar1) {
    do {
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_03);
      if ((pPVar6->super_BaseExpression).type != COLUMN_REF) {
        pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
        local_88._0_8_ = local_88 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"Expected a single expression as join condition","");
        ParserException::ParserException(pPVar7,(string *)local_88);
        __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_03)->super_BaseExpression;
      this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
      bVar4 = ColumnRefExpression::IsQualified(this_01);
      if (bVar4) {
        pPVar7 = (ParserException *)__cxa_allocate_exception(0x10);
        local_88._0_8_ = local_88 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"Expected unqualified column for column in USING clause","");
        ParserException::ParserException(pPVar7,(string *)local_88);
        __cxa_throw(pPVar7,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __x = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](&this_01->column_names,0);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&using_columns,__x);
      this_03 = this_03 + 1;
    } while (this_03 != puVar1);
  }
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_48);
  local_88._0_8_ = (JoinRelation *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::JoinRelation,std::allocator<duckdb::JoinRelation>,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::shared_ptr<duckdb::Relation,true>const&,duckdb::vector<std::__cxx11::string,true>,duckdb::JoinType&,duckdb::JoinRefType&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),(JoinRelation **)local_88,
             (allocator<duckdb::JoinRelation> *)&local_99,
             (shared_ptr<duckdb::Relation,_true> *)&local_48,
             (shared_ptr<duckdb::Relation,_true> *)local_38,&using_columns,&type_local,
             &ref_type_local);
  shared_ptr<duckdb::JoinRelation,_true>::shared_ptr
            ((shared_ptr<duckdb::JoinRelation,_true> *)&local_98,
             (shared_ptr<duckdb::JoinRelation> *)local_88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  _Var2._M_pi = local_98.__weak_this_.internal.
                super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_98.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_98.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var2._M_pi;
  local_98.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  if (local_48.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&using_columns);
  _Var8._M_pi = extraout_RDX;
LAB_004e2cce:
  sVar9.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var8._M_pi;
  sVar9.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar9.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Join(const shared_ptr<Relation> &other,
                                    vector<unique_ptr<ParsedExpression>> expression_list, JoinType type,
                                    JoinRefType ref_type) {
	if (expression_list.size() > 1 || expression_list[0]->GetExpressionType() == ExpressionType::COLUMN_REF) {
		// multiple columns or single column ref: the condition is a USING list
		vector<string> using_columns;
		for (auto &expr : expression_list) {
			if (expr->GetExpressionType() != ExpressionType::COLUMN_REF) {
				throw ParserException("Expected a single expression as join condition");
			}
			auto &colref = expr->Cast<ColumnRefExpression>();
			if (colref.IsQualified()) {
				throw ParserException("Expected unqualified column for column in USING clause");
			}
			using_columns.push_back(colref.column_names[0]);
		}
		return make_shared_ptr<JoinRelation>(shared_from_this(), other, std::move(using_columns), type, ref_type);
	} else {
		// single expression that is not a column reference: use the expression as a join condition
		return make_shared_ptr<JoinRelation>(shared_from_this(), other, std::move(expression_list[0]), type, ref_type);
	}
}